

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O3

void RDL_stack_pop(RDL_stack *stack)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  void **__ptr;
  void **ppvVar4;
  
  uVar1 = stack->size;
  if (uVar1 != 0) {
    stack->size = uVar1 - 1;
    ppvVar3 = stack->top;
    stack->top = ppvVar3 + -1;
    uVar2 = stack->reserved;
    if (0x20 < uVar2 && uVar1 * 2 - 2 < uVar2) {
      __ptr = stack->elements;
      stack->reserved = uVar2 >> 1;
      ppvVar4 = (void **)realloc(__ptr,(ulong)(uVar2 >> 1) * 8);
      stack->elements = ppvVar4;
      stack->top = (void **)(((long)(ppvVar3 + -1) - (long)__ptr & 0x7fffffff8U) + (long)ppvVar4);
    }
  }
  return;
}

Assistant:

void RDL_stack_pop(RDL_stack* stack)
{
  unsigned distance;

  if (stack->size > 0) {
    --stack->size;
    --stack->top;

    if (stack->size * 2 < stack->reserved && stack->reserved > MinSize) {
      distance = stack->top - stack->elements;

      stack->reserved = stack->reserved / 2;

      stack->elements = realloc(stack->elements,
          stack->reserved * sizeof(*stack->elements));

      stack->top = stack->elements + distance;
    }
  }
}